

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O3

double pgamma(double x,double a)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double x_00;
  double dVar6;
  double __x;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_98;
  double local_28;
  
  if (a < 0.0) {
    printf("a must be non-negative");
    exit(1);
  }
  x_00 = a;
  if (2e+20 < a) {
    dVar2 = 2e+20 / a;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    __x = 0.0;
    x_00 = 2e+20;
    x = (x - (a + -0.3333333333333333)) * dVar2 + 2e+20;
    if (x < 0.0) {
      bVar1 = true;
      goto LAB_0013b229;
    }
  }
  __x = x;
  bVar1 = x_00 != 0.0;
  x = __x;
  if (((x_00 != 0.0) || (NAN(x_00))) && ((__x != 0.0 || (NAN(__x))))) {
    bVar1 = true;
    if (__x < x_00 + 1.0) {
      dVar2 = eps(1.0);
      dVar3 = 1.0;
      if (dVar2 * 100.0 <= 1.0) {
        dVar3 = 1.0;
        dVar5 = 1.0;
        dVar2 = x_00;
        do {
          dVar2 = dVar2 + 1.0;
          dVar5 = (dVar5 * __x) / dVar2;
          dVar3 = dVar3 + dVar5;
          dVar7 = -dVar5;
          if (-dVar5 <= dVar5) {
            dVar7 = dVar5;
          }
          dVar9 = eps(dVar3);
        } while (dVar9 * 100.0 <= dVar7);
      }
      dVar2 = log(__x);
      dVar5 = gamma_log(x_00 + 1.0);
      dVar2 = exp((dVar2 * x_00 - __x) - dVar5);
      x = 1.0;
      if (dVar2 * dVar3 <= 1.0 || __x <= 0.0) {
        x = dVar2 * dVar3;
      }
    }
  }
LAB_0013b229:
  if ((bVar1) && (x_00 + 1.0 <= __x)) {
    local_28 = 1.0 / __x;
    local_98 = -local_28;
    dVar2 = local_98;
    if (local_98 <= local_28) {
      dVar2 = local_28;
    }
    dVar3 = eps(dVar2);
    if (dVar3 * 100.0 <= dVar2) {
      dVar5 = 0.0;
      dVar7 = 1.0;
      dVar9 = 1.0;
      dVar10 = 1.0;
      dVar2 = __x;
      dVar3 = local_28;
      do {
        dVar9 = (dVar9 * (dVar10 - x_00) + dVar2) * local_28;
        dVar5 = ((dVar10 - x_00) * dVar5 + dVar7) * local_28;
        dVar2 = dVar2 * local_28 * dVar10 + __x * dVar9;
        dVar7 = __x * dVar5 + local_28 * dVar10 * dVar7;
        local_28 = 1.0 / dVar2;
        dVar10 = dVar10 + 1.0;
        dVar8 = dVar7 * local_28;
        dVar3 = dVar8 - dVar3;
        dVar6 = -dVar3;
        if (-dVar3 <= dVar3) {
          dVar6 = dVar3;
        }
        local_98 = -dVar8;
        dVar3 = local_98;
        if (local_98 <= dVar8) {
          dVar3 = dVar8;
        }
        dVar4 = eps(dVar3);
        dVar3 = dVar8;
      } while (dVar4 * 100.0 <= dVar6);
    }
    dVar2 = log(__x);
    dVar3 = gamma_log(x_00);
    dVar2 = exp((dVar2 * x_00 - __x) - dVar3);
    x = dVar2 * local_98 + 1.0;
  }
  return (double)(-(ulong)(x_00 == 0.0) & 0x3ff0000000000000 |
                 ~-(ulong)(x_00 == 0.0) & ~-(ulong)(__x == 0.0) & (ulong)x);
}

Assistant:

double pgamma(double x, double a) {
	double oup,ct,d,s,la;
	double a0,a1,b0,b1,g,g0,delta,fact;
	// Negative a
	if (a < 0.) {
		printf("a must be non-negative");
		exit(1);
	}
	
	// a -> inf
	la = 2.0e20;
	if (a > la) {
		x = la - 1.0/3.0 + sqrt(la/a)*(x - (a-1.0/3.0));
		a = la;
		if ( x < 0.0) {
			x = 0.0;
		}
	}
	
	// x < a + 1
	
	if ( a != 0 && x != 0 && x < a + 1) {
		ct = a;
		d = 1.;
		s = 1.;
		
		while (normf(d) >= 100*eps(s)) {
			ct += 1.0;
			d = x*d/ct;
			s += d;
		}
		oup = s * exp( -x + a * log(x) - gamma_log(a + 1));
		if ( x > 0 && oup > 1.) {
			oup = 1.0;
		}
	}
	
	if ( a != 0 && x >= a + 1) {
		a0 = 1.0;
		a1 = x;
		b0 = 0.0;
		b1 = 1.0;
		fact = 1.0/a1;
		ct = 1.0;
		g = b1 * fact;
		g0 = b0;
		delta = normf(g - g0);
		
		while (delta >= 100*eps(normf(g))) {
			g0 = g;
			d = ct - a;
			a0 = (a1 + a0*d)*fact;
			b0 = (b1 + b0*d)*fact;
			s = ct*fact;
			a1 = x * a0 + s * a1;
			b1 = x * b0 + s * b1;
			fact = 1.0/a1;
			ct += 1.0;
			g = b1 * fact;
			delta = normf(g - g0);
			
		}
		oup = 1.0 - g * exp( -x + a * log(x) - gamma_log(a));
		
	}
	
	if ( x == 0) {
		oup = 0.0;
	}
	
	if ( a == 0) {
		oup = 1.0;
	}
	
	
	return oup;
}